

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

_Bool store_is_staple(store *s,object_kind *k)

{
  ulong uVar1;
  ulong uVar2;
  
  if (s == (store *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                  ,0x211,"_Bool store_is_staple(struct store *, struct object_kind *)");
  }
  if (k == (object_kind *)0x0) {
    __assert_fail("k",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                  ,0x212,"_Bool store_is_staple(struct store *, struct object_kind *)");
  }
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (s->always_num == uVar2) break;
    uVar1 = uVar2 + 1;
  } while (s->always_table[uVar2] != k);
  return uVar2 < s->always_num;
}

Assistant:

static bool store_is_staple(struct store *s, struct object_kind *k) {
	size_t i;

	assert(s);
	assert(k);

	for (i = 0; i < s->always_num; i++) {
		struct object_kind *l = s->always_table[i];
		if (k == l)
			return true;
	}

	return false;
}